

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseExprPrimary(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'L');
  if ((((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) &&
      (bVar1 = ParseNumber((State *)copy._40_8_,(int *)0x0), bVar1)) &&
     (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    bVar1 = ParseOneCharToken((State *)copy._40_8_,'L');
    if (((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) &&
       ((bVar1 = ParseFloatNumber((State *)copy._40_8_), bVar1 &&
        (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)))) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      bVar1 = ParseOneCharToken((State *)copy._40_8_,'L');
      if (((bVar1) && (bVar1 = ParseMangledName((State *)copy._40_8_), bVar1)) &&
         (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
        state_local._7_1_ = true;
      }
      else {
        memcpy((void *)copy._40_8_,local_48,0x30);
        bVar1 = ParseTwoCharToken((State *)copy._40_8_,"LZ");
        if (((bVar1) && (bVar1 = ParseEncoding((State *)copy._40_8_), bVar1)) &&
           (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
          state_local._7_1_ = true;
        }
        else {
          memcpy((void *)copy._40_8_,local_48,0x30);
          state_local._7_1_ = false;
        }
      }
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseNumber(state, NULL) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseFloatNumber(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "LZ") && ParseEncoding(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  return false;
}